

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sbarinfo_commands.cpp
# Opt level: O3

int __thiscall
CommandDrawInventoryBar::GetCounterSpacing(CommandDrawInventoryBar *this,DSBarInfo *statusBar)

{
  uint uVar1;
  int iVar2;
  FTexture *pFVar3;
  
  uVar1 = statusBar->invBarOffset + 2;
  if (this->style != STYLE_Strife) {
    uVar1 = statusBar->invBarOffset;
  }
  pFVar3 = FImageCollection::operator[](&statusBar->Images,uVar1);
  if (pFVar3 == (FTexture *)0x0) {
    iVar2 = 0x20;
  }
  else {
    uVar1 = (uint)((double)((uint)*(ushort *)
                                   ((long)(pFVar3->gl_info).Material +
                                   (ulong)this->vertical * 2 + -0x10) * 2) /
                  (double)(pFVar3->gl_info).Material[(ulong)this->vertical - 7]);
    iVar2 = (uVar1 & 1) + ((int)uVar1 >> 1) + (uint)(this->style != STYLE_Strife) * 2 + -1;
  }
  return iVar2;
}

Assistant:

int GetCounterSpacing(const DSBarInfo *statusBar) const
		{
			FTexture *box = (style != STYLE_Strife)
				? statusBar->Images[statusBar->invBarOffset + imgARTIBOX]
				: statusBar->Images[statusBar->invBarOffset + imgCURSOR];
			if (box == NULL)
			{ // Don't crash without a graphic.
				return 32;
			}
			else
			{
				int spacing;
				if (!vertical)
				{
					spacing = box->GetScaledWidth();
				}
				else
				{
					spacing = box->GetScaledHeight();
				}
				return spacing + ((style != STYLE_Strife) ? 1 : -1);
			}
		}